

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDEdgeSharpness __thiscall
ON_SubD_ComponentIdTypeAndTag::EdgeSharpness
          (ON_SubD_ComponentIdTypeAndTag *this,bool bUseCreaseSharpness)

{
  ON_SubDEdgeTag OVar1;
  ON_SubDEdgeSharpness OVar2;
  bool bUseCreaseSharpness_local;
  ON_SubD_ComponentIdTypeAndTag *this_local;
  
  OVar1 = EdgeTag(this);
  if (OVar1 == Smooth) {
LAB_0086c0de:
    this_local = *(ON_SubD_ComponentIdTypeAndTag **)(this->m_sharpness).m_edge_sharpness;
  }
  else {
    if (OVar1 == Crease) {
      if (bUseCreaseSharpness) {
        OVar2.m_edge_sharpness[0] = ON_SubDEdgeSharpness::Crease.m_edge_sharpness[0];
        OVar2.m_edge_sharpness[1] = ON_SubDEdgeSharpness::Crease.m_edge_sharpness[1];
        return (ON_SubDEdgeSharpness)OVar2.m_edge_sharpness;
      }
    }
    else if (OVar1 == SmoothX) goto LAB_0086c0de;
    this_local = (ON_SubD_ComponentIdTypeAndTag *)ON_SubDEdgeSharpness::Nan.m_edge_sharpness;
  }
  return (ON_SubDEdgeSharpness)(float  [2])this_local;
}

Assistant:

const ON_SubDEdgeSharpness ON_SubD_ComponentIdTypeAndTag::EdgeSharpness(bool bUseCreaseSharpness) const
{
  switch (EdgeTag())
  {
  case ON_SubDEdgeTag::Smooth:
  case ON_SubDEdgeTag::SmoothX:
    return m_sharpness;
    break;
  case ON_SubDEdgeTag::Crease:
    if (bUseCreaseSharpness)
      return ON_SubDEdgeSharpness::Crease;
    break;
  default:
    break;
  }
  return ON_SubDEdgeSharpness::Nan;
}